

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_i2p_bridge(session_impl *this)

{
  session_settings *this_00;
  int iVar1;
  string *psVar2;
  i2p_session_options session_options;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_40;
  
  this_00 = &this->m_settings;
  psVar2 = session_settings::get_str_abi_cxx11_(this_00,9);
  if (psVar2->_M_string_length == 0) {
    session_options.m_inbound_quantity = 0;
    session_options.m_outbound_quantity = session_options.m_outbound_quantity & 0xffffff00;
    session_options._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    i2p_connection::close(&this->m_i2p_conn,(int)&session_options);
  }
  else {
    session_options.m_inbound_quantity = session_settings::get_int(this_00,0x4099);
    session_options.m_outbound_quantity = session_settings::get_int(this_00,0x409a);
    session_options.m_inbound_length = session_settings::get_int(this_00,0x409b);
    iVar1 = session_settings::get_int(this_00,0x409c);
    session_options.m_outbound_length = iVar1;
    psVar2 = session_settings::get_str_abi_cxx11_(this_00,9);
    iVar1 = session_settings::get_int(this_00,0x407d);
    local_40._M_f = (offset_in_session_impl_to_subr)on_i2p_open;
    local_40._8_8_ = 0;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>_>)this;
    i2p_connection::
    open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (&this->m_i2p_conn,psVar2,iVar1,&session_options,&local_40);
  }
  return;
}

Assistant:

void session_impl::update_i2p_bridge()
	{
		// we need this socket to be open before we
		// can make name lookups for trackers for instance.
		// pause the session now and resume it once we've
		// established the i2p SAM connection
#if TORRENT_USE_I2P
		if (m_settings.get_str(settings_pack::i2p_hostname).empty())
		{
			error_code ec;
			m_i2p_conn.close(ec);
			return;
		}
		TORRENT_ASSERT(!m_abort);
		i2p_session_options session_options{
			m_settings.get_int(settings_pack::i2p_inbound_quantity)
			, m_settings.get_int(settings_pack::i2p_outbound_quantity)
			, m_settings.get_int(settings_pack::i2p_inbound_length)
			, m_settings.get_int(settings_pack::i2p_outbound_length)
		};
		m_i2p_conn.open(m_settings.get_str(settings_pack::i2p_hostname)
			, m_settings.get_int(settings_pack::i2p_port)
			, session_options
			, std::bind(&session_impl::on_i2p_open, this, _1));
#endif
	}